

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O1

IDWNode * __thiscall gmath::IDWNode::add(IDWNode *this,uint _x,uint _y,float _f,float _w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  IDWNode *pIVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  undefined8 uVar17;
  float fVar18;
  
  while (((uVar5 = this->x, _x < uVar5 || (uVar6 = this->s, uVar6 + uVar5 <= _x)) ||
         (uVar8 = this->y, uVar8 + uVar6 <= _y || _y < uVar8))) {
    uVar6 = this->y;
    uVar8 = this->s;
    uVar15 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar15 = -(uint)(uVar8 == 0) | uVar15;
    do {
      do {
        uVar15 = uVar15 + 1;
        bVar12 = (byte)uVar15;
        uVar8 = uVar5 >> (bVar12 & 0x1f);
      } while (_x < uVar8 << (bVar12 & 0x1f));
    } while (((uVar8 + 1 << (bVar12 & 0x1f) <= _x) ||
             (uVar8 = uVar6 >> (bVar12 & 0x1f), _y < uVar8 << (bVar12 & 0x1f))) ||
            (uVar8 + 1 << (bVar12 & 0x1f) <= _y));
    pIVar9 = (IDWNode *)operator_new(0x48);
    uVar8 = -1 << (bVar12 & 0x1f);
    IDWNode(pIVar9,uVar5 & uVar8,uVar6 & uVar8,1 << (bVar12 & 0x1f),this);
    this = pIVar9;
  }
  if (uVar6 < 2) {
    this->f = _f;
    this->w = _w;
  }
  else {
    uVar10 = (ulong)((uint)(uVar8 + (uVar6 >> 1) <= _y) * 2);
    uVar14 = uVar10 + 1;
    if (_x < uVar5 + (uVar6 >> 1)) {
      uVar14 = uVar10;
    }
    if (this->child[uVar14] == (IDWNode *)0x0) {
      pIVar9 = (IDWNode *)operator_new(0x48);
      IDWNode(pIVar9,_x,_y,_f,_w);
    }
    else {
      pIVar9 = add(this->child[uVar14],_x,_y,_f,_w);
    }
    this->child[uVar14] = pIVar9;
    this->n = 0;
    this->f = 0.0;
    this->w = 0.0;
    uVar17 = 0;
    lVar11 = 0;
    iVar13 = 0;
    do {
      pIVar9 = this->child[lVar11];
      if (pIVar9 != (IDWNode *)0x0) {
        iVar7 = pIVar9->n;
        iVar13 = iVar13 + iVar7;
        this->n = iVar13;
        fVar18 = (float)iVar7;
        uVar1 = pIVar9->f;
        uVar3 = pIVar9->w;
        fVar16 = (float)uVar17 + fVar18 * (float)uVar1;
        fVar18 = (float)((ulong)uVar17 >> 0x20) + fVar18 * (float)uVar3;
        uVar17 = CONCAT44(fVar18,fVar16);
        this->f = fVar16;
        this->w = fVar18;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    fVar16 = 1.0 / (float)this->n;
    uVar2 = this->f;
    uVar4 = this->w;
    this->f = fVar16 * (float)uVar2;
    this->w = fVar16 * (float)uVar4;
  }
  return this;
}

Assistant:

IDWNode *IDWNode::add(unsigned int _x, unsigned int _y, float _f, float _w)
{
  IDWNode *ret=this;

  // is value covered by this node?

  if (_x >= x && _x < x+s && _y >= y && _y < y+s)
  {
    if (s > 1)
    {
      // check into which child node the data point falls

      int i;
      if (_x < x+(s>>1))
      {
        i=2;
        if (_y < y+(s>>1))
        {
          i=0;
        }
      }
      else
      {
        i=3;
        if (_y < y+(s>>1))
        {
          i=1;
        }
      }

      // add to child node

      if (child[i] != 0)
      {
        child[i]=child[i]->add(_x, _y, _f, _w);
      }
      else
      {
        child[i]=new IDWNode(_x, _y, _f, _w);
      }

      // recalculate data of this node

      n=0;
      f=0;
      w=0;

      for (i=0; i<4; i++)
      {
        if (child[i] != 0)
        {
          const int cn=child[i]->n;

          n+=cn;
          f+=cn*child[i]->f;
          w+=cn*child[i]->w;
        }
      }

      const float scale=1.0f/n;

      f*=scale;
      w*=scale;
    }
    else
    {
      // replace data of node with given data

      f=_f;
      w=_w;
    }
  }
  else
  {
    // compute size of parent node that covers existing and new data

    int i=-1;
    unsigned int k=s;
    while (k > 0)
    {
      k>>=1;
      i++;
    }

    i++;
    while (_x < (x>>i)<<i || _x >= ((x>>i)+1)<<i || _y < (y>>i)<<i || _y >= ((y>>i)+1)<<i)
      i++;

    // create parent node

    ret=new IDWNode((x>>i)<<i, (y>>i)<<i, 1<<i, this);

    // add new data value

    ret=ret->add(_x, _y, _f, _w);
  }

  return ret;
}